

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Literal * __thiscall
wasm::TranslateToFuzzReader::tweak
          (Literal *__return_storage_ptr__,TranslateToFuzzReader *this,Literal *value)

{
  bool bVar1;
  Index IVar2;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  uintptr_t local_f0;
  undefined1 local_e8 [8];
  Literal adjustment;
  undefined1 local_c8 [8];
  Literal RANGE_LITERAL;
  int RANGE;
  Literal local_a0;
  Literal local_88;
  uintptr_t local_60;
  Literal local_58;
  Literal local_40;
  Type local_28;
  Type type;
  Literal *value_local;
  TranslateToFuzzReader *this_local;
  
  local_28.id = (value->type).id;
  type.id = (uintptr_t)value;
  bVar1 = Type::isVector(&local_28);
  if (bVar1) {
    wasm::Literal::Literal(__return_storage_ptr__,value);
  }
  else {
    IVar2 = upTo(this,5);
    if (IVar2 == 0) {
      local_60 = local_28.id;
      wasm::Literal::makeNegOne((Type)&local_58);
      wasm::Literal::add(&local_40);
      wasm::Literal::operator=(value,&local_40);
      wasm::Literal::~Literal(&local_40);
      wasm::Literal::~Literal(&local_58);
    }
    else if (IVar2 == 1) {
      wasm::Literal::makeOne((Type)&local_a0);
      wasm::Literal::add(&local_88);
      wasm::Literal::operator=(value,&local_88);
      wasm::Literal::~Literal(&local_88);
      wasm::Literal::~Literal(&local_a0);
    }
    bVar1 = Type::isFloat(&local_28);
    if ((bVar1) && (bVar1 = oneIn(this,2), bVar1)) {
      RANGE_LITERAL.type.id._4_4_ = 1000;
      adjustment.type.id = local_28.id;
      Literal::makeFromInt32((Literal *)local_c8,1000,local_28);
      IVar2 = upTo(this,0x7d1);
      local_f0 = local_28.id;
      Literal::makeFromInt32((Literal *)local_e8,IVar2,local_28);
      wasm::Literal::sub(&local_108);
      wasm::Literal::operator=((Literal *)local_e8,&local_108);
      wasm::Literal::~Literal(&local_108);
      wasm::Literal::div(&local_120);
      wasm::Literal::operator=((Literal *)local_e8,&local_120);
      wasm::Literal::~Literal(&local_120);
      wasm::Literal::add(&local_138);
      wasm::Literal::operator=(value,&local_138);
      wasm::Literal::~Literal(&local_138);
      wasm::Literal::~Literal((Literal *)local_e8);
      wasm::Literal::~Literal((Literal *)local_c8);
    }
    bVar1 = oneIn(this,2);
    if (bVar1) {
      wasm::Literal::makeNegOne((Type)&local_168);
      wasm::Literal::mul(&local_150);
      wasm::Literal::operator=(value,&local_150);
      wasm::Literal::~Literal(&local_150);
      wasm::Literal::~Literal(&local_168);
    }
    wasm::Literal::Literal(__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal TranslateToFuzzReader::tweak(Literal value) {
  auto type = value.type;
  if (type.isVector()) {
    // TODO: tweak each lane?
    return value;
  }
  // +- 1
  switch (upTo(5)) {
    case 0:
      value = value.add(Literal::makeNegOne(type));
      break;
    case 1:
      value = value.add(Literal::makeOne(type));
      break;
    default: {
    }
  }
  // For floats, optionally add a non-integer adjustment in +- [-1, 1]
  if (type.isFloat() && oneIn(2)) {
    const int RANGE = 1000;
    auto RANGE_LITERAL = Literal::makeFromInt32(RANGE, type);
    // adjustment -> [0, 2 * RANGE]
    auto adjustment = Literal::makeFromInt32(upTo(2 * RANGE + 1), type);
    // adjustment -> [-RANGE, RANGE]
    adjustment = adjustment.sub(RANGE_LITERAL);
    // adjustment -> [-1, 1]
    adjustment = adjustment.div(RANGE_LITERAL);
    value = value.add(adjustment);
  }
  // Flip sign.
  if (oneIn(2)) {
    value = value.mul(Literal::makeNegOne(type));
  }
  return value;
}